

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

void __thiscall ASDCP::MXF::ISO8String::~ISO8String(ISO8String *this)

{
  ISO8String *this_local;
  
  ~ISO8String(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~ISO8String() {}